

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::TestExtremeDefaultValues::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  TestExtremeDefaultValues *pTVar2;
  string *value_05;
  TestExtremeDefaultValues **v1;
  TestExtremeDefaultValues **v2;
  char *failure_msg;
  LogMessage *pLVar3;
  uint32_t *puVar4;
  Arena *pAVar5;
  string_view sVar6;
  size_t local_238;
  char *local_230;
  size_t local_228;
  char *local_220;
  size_t local_218;
  char *local_210;
  size_t local_208;
  char *local_200;
  size_t local_1f8;
  char *local_1f0;
  size_t local_1e8;
  char *local_1e0;
  MessageLite *local_1d8;
  char *local_1d0;
  uint32_t cached_has_bits;
  LogMessage local_1b8;
  Voidify local_1a1;
  TestExtremeDefaultValues *local_1a0;
  Nullable<const_char_*> local_198;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  TestExtremeDefaultValues *from;
  TestExtremeDefaultValues *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  char *local_168;
  TestExtremeDefaultValues *local_160;
  MessageLite *local_158;
  char *local_150;
  anon_union_176_1_493b367e_for_TestExtremeDefaultValues_3 *local_148;
  size_t local_140;
  char *local_138;
  TestExtremeDefaultValues *local_130;
  size_t local_128;
  char *local_120;
  anon_union_176_1_493b367e_for_TestExtremeDefaultValues_3 *local_118;
  size_t local_110;
  char *local_108;
  TestExtremeDefaultValues *local_100;
  size_t local_f8;
  char *local_f0;
  anon_union_176_1_493b367e_for_TestExtremeDefaultValues_3 *local_e8;
  size_t local_e0;
  char *local_d8;
  TestExtremeDefaultValues *local_d0;
  size_t local_c8;
  char *local_c0;
  anon_union_176_1_493b367e_for_TestExtremeDefaultValues_3 *local_b8;
  size_t local_b0;
  char *local_a8;
  TestExtremeDefaultValues *local_a0;
  size_t local_98;
  char *local_90;
  anon_union_176_1_493b367e_for_TestExtremeDefaultValues_3 *local_88;
  size_t local_80;
  char *local_78;
  TestExtremeDefaultValues *local_70;
  size_t local_68;
  char *local_60;
  anon_union_176_1_493b367e_for_TestExtremeDefaultValues_3 *local_58;
  string *local_50;
  TestExtremeDefaultValues *local_48;
  anon_union_176_1_493b367e_for_TestExtremeDefaultValues_3 *local_40;
  size_t local_38;
  char *local_30;
  TestExtremeDefaultValues *local_28;
  size_t local_20;
  char *local_18;
  anon_union_176_1_493b367e_for_TestExtremeDefaultValues_3 *local_10;
  
  local_1a0 = (TestExtremeDefaultValues *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (TestExtremeDefaultValues *)to_msg;
  _this = (TestExtremeDefaultValues *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestExtremeDefaultValues_const*>(&local_1a0);
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::TestExtremeDefaultValues*>(&from);
  local_198 = absl::lts_20250127::log_internal::
              Check_NEImpl<edition_unittest::TestExtremeDefaultValues_const*,edition_unittest::TestExtremeDefaultValues*>
                        (v1,v2,"&from != _this");
  if (local_198 == (Nullable<const_char_*>)0x0) {
    puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x10),0);
    pTVar2 = from;
    uVar1 = *puVar4;
    if ((uVar1 & 0xff) != 0) {
      if ((uVar1 & 1) != 0) {
        sVar6 = _internal_escaped_bytes
                          ((TestExtremeDefaultValues *)absl_log_internal_check_op_result);
        local_1d8 = (MessageLite *)sVar6._M_len;
        local_1d0 = sVar6._M_str;
        local_158 = local_1d8;
        local_150 = local_1d0;
        local_160 = pTVar2;
        local_148 = &pTVar2->field_0;
        puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                           (&(pTVar2->field_0)._impl_._has_bits_,0);
        *puVar4 = *puVar4 | 1;
        to_msg_local = local_158;
        local_168 = local_150;
        pAVar5 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
        sVar6._M_str = local_168;
        sVar6._M_len = (size_t)to_msg_local;
        google::protobuf::internal::ArenaStringPtr::Set
                  (&(pTVar2->field_0)._impl_.escaped_bytes_,sVar6,pAVar5);
      }
      pTVar2 = from;
      if ((uVar1 & 2) != 0) {
        sVar6 = _internal_utf8_string((TestExtremeDefaultValues *)absl_log_internal_check_op_result)
        ;
        local_1e8 = sVar6._M_len;
        local_1e0 = sVar6._M_str;
        local_128 = local_1e8;
        local_120 = local_1e0;
        local_130 = pTVar2;
        local_118 = &pTVar2->field_0;
        puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                           (&(pTVar2->field_0)._impl_._has_bits_,0);
        *puVar4 = *puVar4 | 2;
        local_140 = local_128;
        local_138 = local_120;
        pAVar5 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
        value._M_str = local_138;
        value._M_len = local_140;
        google::protobuf::internal::ArenaStringPtr::Set
                  (&(pTVar2->field_0)._impl_.utf8_string_,value,pAVar5);
      }
      pTVar2 = from;
      if ((uVar1 & 4) != 0) {
        sVar6 = _internal_cpp_trigraph
                          ((TestExtremeDefaultValues *)absl_log_internal_check_op_result);
        local_1f8 = sVar6._M_len;
        local_1f0 = sVar6._M_str;
        local_f8 = local_1f8;
        local_f0 = local_1f0;
        local_100 = pTVar2;
        local_e8 = &pTVar2->field_0;
        puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                           (&(pTVar2->field_0)._impl_._has_bits_,0);
        *puVar4 = *puVar4 | 4;
        local_110 = local_f8;
        local_108 = local_f0;
        pAVar5 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
        value_00._M_str = local_108;
        value_00._M_len = local_110;
        google::protobuf::internal::ArenaStringPtr::Set
                  (&(pTVar2->field_0)._impl_.cpp_trigraph_,value_00,pAVar5);
      }
      pTVar2 = from;
      if ((uVar1 & 8) != 0) {
        sVar6 = _internal_string_with_zero
                          ((TestExtremeDefaultValues *)absl_log_internal_check_op_result);
        local_208 = sVar6._M_len;
        local_200 = sVar6._M_str;
        local_c8 = local_208;
        local_c0 = local_200;
        local_d0 = pTVar2;
        local_b8 = &pTVar2->field_0;
        puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                           (&(pTVar2->field_0)._impl_._has_bits_,0);
        *puVar4 = *puVar4 | 8;
        local_e0 = local_c8;
        local_d8 = local_c0;
        pAVar5 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
        value_01._M_str = local_d8;
        value_01._M_len = local_e0;
        google::protobuf::internal::ArenaStringPtr::Set
                  (&(pTVar2->field_0)._impl_.string_with_zero_,value_01,pAVar5);
      }
      pTVar2 = from;
      if ((uVar1 & 0x10) != 0) {
        sVar6 = _internal_bytes_with_zero
                          ((TestExtremeDefaultValues *)absl_log_internal_check_op_result);
        local_218 = sVar6._M_len;
        local_210 = sVar6._M_str;
        local_98 = local_218;
        local_90 = local_210;
        local_a0 = pTVar2;
        local_88 = &pTVar2->field_0;
        puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                           (&(pTVar2->field_0)._impl_._has_bits_,0);
        *puVar4 = *puVar4 | 0x10;
        local_b0 = local_98;
        local_a8 = local_90;
        pAVar5 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
        value_02._M_str = local_a8;
        value_02._M_len = local_b0;
        google::protobuf::internal::ArenaStringPtr::Set
                  (&(pTVar2->field_0)._impl_.bytes_with_zero_,value_02,pAVar5);
      }
      pTVar2 = from;
      if ((uVar1 & 0x20) != 0) {
        sVar6 = _internal_string_piece_with_zero
                          ((TestExtremeDefaultValues *)absl_log_internal_check_op_result);
        local_228 = sVar6._M_len;
        local_220 = sVar6._M_str;
        local_68 = local_228;
        local_60 = local_220;
        local_70 = pTVar2;
        local_58 = &pTVar2->field_0;
        puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                           (&(pTVar2->field_0)._impl_._has_bits_,0);
        *puVar4 = *puVar4 | 0x20;
        local_80 = local_68;
        local_78 = local_60;
        pAVar5 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
        value_03._M_str = local_78;
        value_03._M_len = local_80;
        google::protobuf::internal::ArenaStringPtr::Set
                  (&(pTVar2->field_0)._impl_.string_piece_with_zero_,value_03,pAVar5);
      }
      pTVar2 = from;
      if ((uVar1 & 0x40) != 0) {
        local_50 = _internal_cord_with_zero_abi_cxx11_
                             ((TestExtremeDefaultValues *)absl_log_internal_check_op_result);
        local_48 = pTVar2;
        local_40 = &pTVar2->field_0;
        puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                           (&(pTVar2->field_0)._impl_._has_bits_,0);
        value_05 = local_50;
        *puVar4 = *puVar4 | 0x40;
        pAVar5 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
        google::protobuf::internal::ArenaStringPtr::Set<>
                  (&(pTVar2->field_0)._impl_.cord_with_zero_,value_05,pAVar5);
      }
      pTVar2 = from;
      if ((uVar1 & 0x80) != 0) {
        sVar6 = _internal_replacement_string
                          ((TestExtremeDefaultValues *)absl_log_internal_check_op_result);
        local_238 = sVar6._M_len;
        local_230 = sVar6._M_str;
        local_20 = local_238;
        local_18 = local_230;
        local_28 = pTVar2;
        local_10 = &pTVar2->field_0;
        puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                           (&(pTVar2->field_0)._impl_._has_bits_,0);
        *puVar4 = *puVar4 | 0x80;
        local_38 = local_20;
        local_30 = local_18;
        pAVar5 = google::protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
        value_04._M_str = local_30;
        value_04._M_len = local_38;
        google::protobuf::internal::ArenaStringPtr::Set
                  (&(pTVar2->field_0)._impl_.replacement_string_,value_04,pAVar5);
      }
    }
    if ((uVar1 & 0xff00) != 0) {
      if ((uVar1 & 0x100) != 0) {
        (from->field_0)._impl_.zero_float_ = *(float *)(absl_log_internal_check_op_result + 0x58);
      }
      if ((uVar1 & 0x200) != 0) {
        (from->field_0)._impl_.large_uint64_ =
             *(uint64_t *)(absl_log_internal_check_op_result + 0x60);
      }
      if ((uVar1 & 0x400) != 0) {
        (from->field_0)._impl_.large_uint32_ =
             *(uint32_t *)(absl_log_internal_check_op_result + 0x68);
      }
      if ((uVar1 & 0x800) != 0) {
        (from->field_0)._impl_.small_int32_ = *(int32_t *)(absl_log_internal_check_op_result + 0x6c)
        ;
      }
      if ((uVar1 & 0x1000) != 0) {
        (from->field_0)._impl_.small_int64_ = *(int64_t *)(absl_log_internal_check_op_result + 0x70)
        ;
      }
      if ((uVar1 & 0x2000) != 0) {
        (from->field_0)._impl_.one_float_ = *(float *)(absl_log_internal_check_op_result + 0x78);
      }
      if ((uVar1 & 0x4000) != 0) {
        (from->field_0)._impl_.small_float_ = *(float *)(absl_log_internal_check_op_result + 0x7c);
      }
      if ((uVar1 & 0x8000) != 0) {
        (from->field_0)._impl_.negative_one_float_ =
             *(float *)(absl_log_internal_check_op_result + 0x80);
      }
    }
    if ((uVar1 & 0xff0000) != 0) {
      if ((uVar1 & 0x10000) != 0) {
        (from->field_0)._impl_.negative_float_ =
             *(float *)(absl_log_internal_check_op_result + 0x84);
      }
      if ((uVar1 & 0x20000) != 0) {
        (from->field_0)._impl_.large_float_ = *(float *)(absl_log_internal_check_op_result + 0x88);
      }
      if ((uVar1 & 0x40000) != 0) {
        (from->field_0)._impl_.small_negative_float_ =
             *(float *)(absl_log_internal_check_op_result + 0x8c);
      }
      if ((uVar1 & 0x80000) != 0) {
        (from->field_0)._impl_.inf_double_ = *(double *)(absl_log_internal_check_op_result + 0x90);
      }
      if ((uVar1 & 0x100000) != 0) {
        (from->field_0)._impl_.neg_inf_double_ =
             *(double *)(absl_log_internal_check_op_result + 0x98);
      }
      if ((uVar1 & 0x200000) != 0) {
        (from->field_0)._impl_.nan_double_ = *(double *)(absl_log_internal_check_op_result + 0xa0);
      }
      if ((uVar1 & 0x400000) != 0) {
        (from->field_0)._impl_.inf_float_ = *(float *)(absl_log_internal_check_op_result + 0xa8);
      }
      if ((uVar1 & 0x800000) != 0) {
        (from->field_0)._impl_.neg_inf_float_ = *(float *)(absl_log_internal_check_op_result + 0xac)
        ;
      }
    }
    if ((uVar1 & 0x7000000) != 0) {
      if ((uVar1 & 0x1000000) != 0) {
        (from->field_0)._impl_.nan_float_ = *(float *)(absl_log_internal_check_op_result + 0xb0);
      }
      if ((uVar1 & 0x2000000) != 0) {
        (from->field_0)._impl_.really_small_int32_ =
             *(int32_t *)(absl_log_internal_check_op_result + 0xb4);
      }
      if ((uVar1 & 0x4000000) != 0) {
        (from->field_0)._impl_.really_small_int64_ =
             *(int64_t *)(absl_log_internal_check_op_result + 0xb8);
      }
    }
    puVar4 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar4 = uVar1 | *puVar4;
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_198);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_1b8,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
             ,0x72dd,failure_msg);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1b8);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_1a1,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8)
  ;
}

Assistant:

void TestExtremeDefaultValues::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestExtremeDefaultValues*>(&to_msg);
  auto& from = static_cast<const TestExtremeDefaultValues&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestExtremeDefaultValues)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_escaped_bytes(from._internal_escaped_bytes());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_utf8_string(from._internal_utf8_string());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_cpp_trigraph(from._internal_cpp_trigraph());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_string_with_zero(from._internal_string_with_zero());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_internal_set_bytes_with_zero(from._internal_bytes_with_zero());
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_internal_set_string_piece_with_zero(from._internal_string_piece_with_zero());
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_internal_set_cord_with_zero(from._internal_cord_with_zero());
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_internal_set_replacement_string(from._internal_replacement_string());
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_impl_.zero_float_ = from._impl_.zero_float_;
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_impl_.large_uint64_ = from._impl_.large_uint64_;
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      _this->_impl_.large_uint32_ = from._impl_.large_uint32_;
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.small_int32_ = from._impl_.small_int32_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.small_int64_ = from._impl_.small_int64_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.one_float_ = from._impl_.one_float_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.small_float_ = from._impl_.small_float_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.negative_one_float_ = from._impl_.negative_one_float_;
    }
  }
  if ((cached_has_bits & 0x00ff0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      _this->_impl_.negative_float_ = from._impl_.negative_float_;
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      _this->_impl_.large_float_ = from._impl_.large_float_;
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      _this->_impl_.small_negative_float_ = from._impl_.small_negative_float_;
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      _this->_impl_.inf_double_ = from._impl_.inf_double_;
    }
    if ((cached_has_bits & 0x00100000u) != 0) {
      _this->_impl_.neg_inf_double_ = from._impl_.neg_inf_double_;
    }
    if ((cached_has_bits & 0x00200000u) != 0) {
      _this->_impl_.nan_double_ = from._impl_.nan_double_;
    }
    if ((cached_has_bits & 0x00400000u) != 0) {
      _this->_impl_.inf_float_ = from._impl_.inf_float_;
    }
    if ((cached_has_bits & 0x00800000u) != 0) {
      _this->_impl_.neg_inf_float_ = from._impl_.neg_inf_float_;
    }
  }
  if ((cached_has_bits & 0x07000000u) != 0) {
    if ((cached_has_bits & 0x01000000u) != 0) {
      _this->_impl_.nan_float_ = from._impl_.nan_float_;
    }
    if ((cached_has_bits & 0x02000000u) != 0) {
      _this->_impl_.really_small_int32_ = from._impl_.really_small_int32_;
    }
    if ((cached_has_bits & 0x04000000u) != 0) {
      _this->_impl_.really_small_int64_ = from._impl_.really_small_int64_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}